

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmetrohash64.c
# Opt level: O3

void cmetrohash64_1(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 *puVar3;
  undefined1 *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  undefined1 (*pauVar8) [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  
  uVar5 = len + 0x60e25d3baf065edb + (ulong)seed * 0xc83a91e1;
  pauVar8 = (undefined1 (*) [16])key;
  if (0x1f < len) {
    auVar2 = vpmovzxdq_avx(ZEXT816(0x8648dbdbc83a91e1));
    auVar1 = vpmovsxdq_avx(ZEXT816(0x2f5870a57bdec03b));
    auVar12 = vpbroadcastq_avx512vl();
    auVar15 = auVar12;
    do {
      auVar13 = vpmullq_avx512vl(auVar2,*pauVar8);
      auVar14 = vpmullq_avx512vl(auVar1,pauVar8[1]);
      pauVar8 = pauVar8 + 2;
      auVar15 = vpaddq_avx(auVar13,auVar15);
      auVar15 = vprolq_avx512vl(auVar15,0x23);
      auVar15 = vpaddq_avx(auVar15,auVar12);
      auVar12 = vpaddq_avx(auVar14,auVar12);
      auVar12 = vprolq_avx512vl(auVar12,0x23);
      auVar12 = vpaddq_avx(auVar12,auVar15);
    } while (pauVar8 <= (undefined1 (*) [16])(key + (len - 0x20)));
    uVar10 = vpextrq_avx(auVar12,1);
    uVar16 = auVar15._0_8_;
    uVar9 = vpextrq_avx(auVar15,1);
    uVar6 = (uVar10 + uVar16) * 0xc83a91e1 + uVar9;
    uVar11 = auVar12._0_8_ ^ (uVar6 >> 0x21 | uVar6 * 0x80000000) * 0x8648dbdb;
    uVar6 = (uVar11 + uVar9) * 0x8648dbdb + uVar16;
    uVar10 = (uVar6 >> 0x21 | uVar6 * 0x80000000) * 0xc83a91e1 ^ uVar10;
    uVar6 = (uVar11 + uVar16) * 0xc83a91e1 + uVar10;
    uVar11 = (uVar10 + uVar9) * 0x8648dbdb + uVar11;
    uVar5 = uVar5 + ((uVar6 >> 0x21 | uVar6 * 0x80000000) * 0x8648dbdb ^ uVar16 ^ uVar9 ^
                    (uVar11 >> 0x21 | uVar11 * 0x80000000) * 0xc83a91e1);
  }
  puVar7 = key + (len - (long)pauVar8);
  if (0xf < (long)puVar7) {
    puVar3 = *pauVar8;
    puVar4 = *pauVar8;
    pauVar8 = pauVar8 + 1;
    uVar10 = *(long *)puVar3 * 0xc83a91e1 + uVar5;
    uVar6 = *(long *)(puVar4 + 8) * 0x8648dbdb + uVar5;
    uVar10 = uVar10 >> 0x21 | uVar10 * 0x80000000;
    uVar6 = uVar6 >> 0x21 | uVar6 * 0x80000000;
    puVar7 = key + (len - (long)pauVar8);
    uVar5 = uVar5 + ((uVar6 * -0x3981893f20000000 | uVar6 * 0x16e8b05e33f3b607 >> 0x23) +
                     ((uVar10 * 0x4645c8cf60000000 | uVar10 * 0x6907a4ca322e467b >> 0x23) +
                      uVar6 * 0x7bdec03b ^ uVar10 * 0x8648dbdb) ^ uVar6 * 0x7bdec03b);
  }
  if (7 < (long)puVar7) {
    puVar3 = *pauVar8;
    pauVar8 = (undefined1 (*) [16])(*pauVar8 + 8);
    uVar5 = *(long *)puVar3 * 0x2f5870a5 + uVar5;
    uVar5 = (uVar5 >> 0x21 | uVar5 * 0x80000000) * 0x8648dbdb ^ uVar5;
    puVar7 = key + (len - (long)pauVar8);
  }
  if (3 < (long)puVar7) {
    puVar3 = *pauVar8;
    pauVar8 = (undefined1 (*) [16])(*pauVar8 + 4);
    uVar5 = (ulong)*(uint *)puVar3 * 0x2f5870a5 + uVar5;
    uVar5 = (uVar5 >> 0xf | uVar5 << 0x31) * 0x8648dbdb ^ uVar5;
    puVar7 = key + (len - (long)pauVar8);
  }
  if (1 < (long)puVar7) {
    puVar3 = *pauVar8;
    pauVar8 = (undefined1 (*) [16])(*pauVar8 + 2);
    puVar7 = key + (len - (long)pauVar8);
    uVar5 = (ulong)*(ushort *)puVar3 * 0x2f5870a5 + uVar5;
    uVar5 = (uVar5 >> 0xd | uVar5 << 0x33) * 0x8648dbdb ^ uVar5;
  }
  if (0 < (long)puVar7) {
    uVar5 = (ulong)(byte)(*pauVar8)[0] * 0x2f5870a5 + uVar5;
    uVar5 = (uVar5 >> 0x19 | uVar5 << 0x27) * 0x8648dbdb ^ uVar5;
  }
  uVar5 = (uVar5 >> 0x21 | uVar5 << 0x1f) ^ uVar5;
  uVar6 = uVar5 * 0xc83a91e1;
  *(ulong *)out = (uVar5 * 0x641d48f080000000 | uVar6 >> 0x21) ^ uVar6;
  return;
}

Assistant:

void cmetrohash64_1(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xC83A91E1;
    static const uint64_t k1 = 0x8648DBDB;
    static const uint64_t k2 = 0x7BDEC03B;
    static const uint64_t k3 = 0x2F5870A5;

    const uint8_t * ptr = key;
    const uint8_t * const end = ptr + len;
    
    uint64_t hash = ((((uint64_t) seed) + k2) * k0) + len;
    
    if (len >= 32)
    {
        uint64_t v[4];
        v[0] = hash;
        v[1] = hash;
        v[2] = hash;
        v[3] = hash;
        
        do
        {
            v[0] += cread_u64(ptr) * k0; ptr += 8; v[0] = crotate_right(v[0],29) + v[2];
            v[1] += cread_u64(ptr) * k1; ptr += 8; v[1] = crotate_right(v[1],29) + v[3];
            v[2] += cread_u64(ptr) * k2; ptr += 8; v[2] = crotate_right(v[2],29) + v[0];
            v[3] += cread_u64(ptr) * k3; ptr += 8; v[3] = crotate_right(v[3],29) + v[1];
        }
        while (ptr <= (end - 32));

        v[2] ^= crotate_right(((v[0] + v[3]) * k0) + v[1], 33) * k1;
        v[3] ^= crotate_right(((v[1] + v[2]) * k1) + v[0], 33) * k0;
        v[0] ^= crotate_right(((v[0] + v[2]) * k0) + v[3], 33) * k1;
        v[1] ^= crotate_right(((v[1] + v[3]) * k1) + v[2], 33) * k0;
        hash += v[0] ^ v[1];
    }
    
    if ((end - ptr) >= 16)
    {
        uint64_t v0 = hash + (cread_u64(ptr) * k0); ptr += 8; v0 = crotate_right(v0,33) * k1;
        uint64_t v1 = hash + (cread_u64(ptr) * k1); ptr += 8; v1 = crotate_right(v1,33) * k2;
        v0 ^= crotate_right(v0 * k0, 35) + v1;
        v1 ^= crotate_right(v1 * k3, 35) + v0;
        hash += v1;
    }
    
    if ((end - ptr) >= 8)
    {
        hash += cread_u64(ptr) * k3; ptr += 8;
        hash ^= crotate_right(hash, 33) * k1;
        
    }
    
    if ((end - ptr) >= 4)
    {
        hash += cread_u32(ptr) * k3; ptr += 4;
        hash ^= crotate_right(hash, 15) * k1;
    }
    
    if ((end - ptr) >= 2)
    {
        hash += cread_u16(ptr) * k3; ptr += 2;
        hash ^= crotate_right(hash, 13) * k1;
    }
    
    if ((end - ptr) >= 1)
    {
        hash += cread_u8 (ptr) * k3;
        hash ^= crotate_right(hash, 25) * k1;
    }
    
    hash ^= crotate_right(hash, 33);
    hash *= k0;
    hash ^= crotate_right(hash, 33);

    memcpy(out, &hash, 8);
}